

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_subtract_txb(MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int blk_col,int blk_row,
                     TX_SIZE tx_size)

{
  int iVar1;
  long *plVar2;
  long pred_stride;
  BitDepthInfo bd_info_00;
  long lVar3;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int16_t *src_diff;
  uint8_t *src;
  uint8_t *dst;
  int tx1d_height;
  int tx1d_width;
  int dst_stride;
  int src_stride;
  int diff_stride;
  macroblockd_plane *pd;
  macroblock_plane *p;
  BitDepthInfo bd_info;
  MACROBLOCKD *xd;
  MACROBLOCKD *in_stack_ffffffffffffff78;
  
  get_bit_depth_info(in_stack_ffffffffffffff78);
  plVar2 = (long *)(in_RDI + (long)in_ESI * 0x88);
  pred_stride = in_RDI + 0x1b0 + (long)in_ESI * 0xa30;
  iVar1 = *(int *)(pred_stride + 0x28);
  bd_info_00 = (BitDepthInfo)(*(long *)(pred_stride + 0x10) + (long)((in_R8D * iVar1 + in_ECX) * 4))
  ;
  lVar3 = plVar2[6] + (long)((in_R8D * (int)plVar2[9] + in_ECX) * 4);
  av1_subtract_block(bd_info_00,(int)((ulong)lVar3 >> 0x20),(int)lVar3,
                     (int16_t *)
                     (*plVar2 +
                     (long)(int)((in_R8D * (uint)block_size_wide[in_DL] + in_ECX) * 4) * 2),
                     (long)iVar1,(uint8_t *)bd_info_00,CONCAT44(iVar1,tx_size_wide[in_R9B]),
                     (uint8_t *)(ulong)CONCAT14(block_size_wide[in_DL],(int)plVar2[9]),pred_stride);
  return;
}

Assistant:

void av1_subtract_txb(MACROBLOCK *x, int plane, BLOCK_SIZE plane_bsize,
                      int blk_col, int blk_row, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  struct macroblock_plane *const p = &x->plane[plane];
  const struct macroblockd_plane *const pd = &x->e_mbd.plane[plane];
  const int diff_stride = block_size_wide[plane_bsize];
  const int src_stride = p->src.stride;
  const int dst_stride = pd->dst.stride;
  const int tx1d_width = tx_size_wide[tx_size];
  const int tx1d_height = tx_size_high[tx_size];
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  uint8_t *src = &p->src.buf[(blk_row * src_stride + blk_col) << MI_SIZE_LOG2];
  int16_t *src_diff =
      &p->src_diff[(blk_row * diff_stride + blk_col) << MI_SIZE_LOG2];
  av1_subtract_block(bd_info, tx1d_height, tx1d_width, src_diff, diff_stride,
                     src, src_stride, dst, dst_stride);
}